

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall mjs::continue_statement::print(continue_statement *this,wostream *os)

{
  size_type sVar1;
  
  std::operator<<(os,"continue_statement{");
  sVar1 = (this->id_)._M_string_length;
  if (sVar1 != 0) {
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,(this->id_)._M_dataplus._M_p,sVar1);
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "continue_statement{";
        if (!id_.empty()) {
            os << id_;
        }
        os << "}";
    }